

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void random_fe_non_zero(secp256k1_fe *nz)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -0xb;
  do {
    iVar2 = iVar2 + 1;
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xbc7,"test condition failed: tries >= 0");
      abort();
    }
    random_fe(nz);
    secp256k1_fe_normalize(nz);
    iVar1 = secp256k1_fe_is_zero(nz);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void random_fe_non_zero(secp256k1_fe *nz) {
    int tries = 10;
    while (--tries >= 0) {
        random_fe(nz);
        secp256k1_fe_normalize(nz);
        if (!secp256k1_fe_is_zero(nz)) {
            break;
        }
    }
    /* Infinitesimal probability of spurious failure here */
    CHECK(tries >= 0);
}